

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_window_close(nk_context *ctx,char *name)

{
  nk_window *pnVar1;
  nk_window *win;
  char *name_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x40b3,"void nk_window_close(struct nk_context *, const char *)");
  }
  if ((ctx != (nk_context *)0x0) && (pnVar1 = nk_window_find(ctx,name), pnVar1 != (nk_window *)0x0))
  {
    if (ctx->current == pnVar1) {
      __assert_fail("ctx->current != win && \"You cannot close a currently active window\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                    ,0x40b7,"void nk_window_close(struct nk_context *, const char *)");
    }
    if (ctx->current != pnVar1) {
      pnVar1->flags = pnVar1->flags | 0x2000;
      pnVar1->flags = pnVar1->flags | 0x4000;
    }
  }
  return;
}

Assistant:

NK_API void
nk_window_close(struct nk_context *ctx, const char *name)
{
    struct nk_window *win;
    NK_ASSERT(ctx);
    if (!ctx) return;
    win = nk_window_find(ctx, name);
    if (!win) return;
    NK_ASSERT(ctx->current != win && "You cannot close a currently active window");
    if (ctx->current == win) return;
    win->flags |= NK_WINDOW_HIDDEN;
    win->flags |= NK_WINDOW_CLOSED;
}